

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_sign_hash(psa_key_handle_t handle,psa_algorithm_t alg,uint8_t *hash,size_t hash_length,
             uint8_t *signature,size_t signature_size,size_t *signature_length)

{
  ulong uVar1;
  ushort uVar2;
  mbedtls_rsa_context *pmVar3;
  psa_status_t pVar4;
  int ret;
  mbedtls_md_type_t md_alg;
  size_t sVar5;
  mbedtls_md_info_t *md_info;
  psa_algorithm_t alg_00;
  ulong buflen;
  mbedtls_mpi r;
  psa_key_slot_t *slot;
  mbedtls_mpi local_48;
  
  *signature_length = signature_size;
  if (signature_size == 0) {
    return -0x8a;
  }
  pVar4 = psa_get_key_from_slot(handle,&slot,0x400,alg);
  if (pVar4 != 0) goto LAB_00111e61;
  uVar2 = (slot->attr).type;
  pVar4 = -0x87;
  if ((~uVar2 & 0x7000) != 0) goto LAB_00111e61;
  if (uVar2 == 0x7001) {
    pmVar3 = (slot->data).rsa;
    pVar4 = psa_rsa_decode_md_type(alg,hash_length,(mbedtls_md_type_t *)&r);
    if (pVar4 == 0) {
      sVar5 = mbedtls_rsa_get_len(pmVar3);
      pVar4 = -0x8a;
      if (sVar5 <= signature_size) {
        if ((alg & 0xffffff00) == 0x10030000) {
          mbedtls_rsa_set_padding(pmVar3,1,r.s);
          ret = mbedtls_rsa_rsassa_pss_sign
                          (pmVar3,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,1,MBEDTLS_MD_NONE,
                           (uint)hash_length,hash,signature);
        }
        else {
          pVar4 = -0x87;
          if ((alg & 0xffffff00) != 0x10020000) goto LAB_00111e5c;
          mbedtls_rsa_set_padding(pmVar3,0,0);
          ret = mbedtls_rsa_pkcs1_sign
                          (pmVar3,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,1,r.s,
                           (uint)hash_length,hash,signature);
        }
        if (ret == 0) {
          sVar5 = mbedtls_rsa_get_len(pmVar3);
          *signature_length = sVar5;
        }
        goto LAB_00111e54;
      }
    }
  }
  else {
    pVar4 = -0x86;
    if (((uVar2 & 0xcf00) != 0x4100) || (pVar4 = -0x87, (alg & 0xfffeff00) != 0x10060000))
    goto LAB_00111e61;
    pmVar3 = (slot->data).rsa;
    buflen = (long)(pmVar3->DQ).p + 7U >> 3;
    mbedtls_mpi_init(&r);
    mbedtls_mpi_init(&local_48);
    uVar1 = buflen * 2;
    ret = -0x4f00;
    if (uVar1 < signature_size || uVar1 - signature_size == 0) {
      if ((alg >> 0x10 & 1) == 0) {
        ret = mbedtls_ecdsa_sign((mbedtls_ecp_group *)pmVar3,&r,&local_48,
                                 (mbedtls_mpi *)&(pmVar3->RP).p,hash,hash_length,
                                 mbedtls_ctr_drbg_random,&global_data.ctr_drbg);
      }
      else {
        alg_00 = (alg & 0xff) + 0x1000000;
        if ((alg & 0xff) == 0) {
          alg_00 = 0;
        }
        md_info = mbedtls_md_info_from_psa(alg_00);
        md_alg = mbedtls_md_get_type(md_info);
        ret = mbedtls_ecdsa_sign_det_ext
                        ((mbedtls_ecp_group *)pmVar3,&r,&local_48,(mbedtls_mpi *)&(pmVar3->RP).p,
                         hash,hash_length,md_alg,mbedtls_ctr_drbg_random,&global_data.ctr_drbg);
      }
      if ((ret == 0) && (ret = mbedtls_mpi_write_binary(&r,signature,buflen), ret == 0)) {
        ret = mbedtls_mpi_write_binary(&local_48,signature + buflen,buflen);
      }
    }
    mbedtls_mpi_free(&r);
    mbedtls_mpi_free(&local_48);
    if (ret == 0) {
      *signature_length = uVar1;
    }
LAB_00111e54:
    pVar4 = mbedtls_to_psa_error(ret);
  }
LAB_00111e5c:
  if (pVar4 == 0) {
    memset(signature + *signature_length,0x21,signature_size - *signature_length);
    return 0;
  }
LAB_00111e61:
  memset(signature,0x21,signature_size);
  return pVar4;
}

Assistant:

psa_status_t psa_sign_hash( psa_key_handle_t handle,
                            psa_algorithm_t alg,
                            const uint8_t *hash,
                            size_t hash_length,
                            uint8_t *signature,
                            size_t signature_size,
                            size_t *signature_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    const psa_drv_se_t *drv;
    psa_drv_se_context_t *drv_context;
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    *signature_length = signature_size;
    /* Immediately reject a zero-length signature buffer. This guarantees
     * that signature must be a valid pointer. (On the other hand, the hash
     * buffer can in principle be empty since it doesn't actually have
     * to be a hash.) */
    if( signature_size == 0 )
        return( PSA_ERROR_BUFFER_TOO_SMALL );

    status = psa_get_key_from_slot( handle, &slot, PSA_KEY_USAGE_SIGN_HASH, alg );
    if( status != PSA_SUCCESS )
        goto exit;
    if( ! PSA_KEY_TYPE_IS_KEY_PAIR( slot->attr.type ) )
    {
        status = PSA_ERROR_INVALID_ARGUMENT;
        goto exit;
    }

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( psa_get_se_driver( slot->attr.lifetime, &drv, &drv_context ) )
    {
        if( drv->asymmetric == NULL ||
            drv->asymmetric->p_sign == NULL )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        status = drv->asymmetric->p_sign( drv_context,
                                          slot->data.se.slot_number,
                                          alg,
                                          hash, hash_length,
                                          signature, signature_size,
                                          signature_length );
    }
    else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
#if defined(MBEDTLS_RSA_C)
    if( slot->attr.type == PSA_KEY_TYPE_RSA_KEY_PAIR )
    {
        status = psa_rsa_sign( slot->data.rsa,
                               alg,
                               hash, hash_length,
                               signature, signature_size,
                               signature_length );
    }
    else
#endif /* defined(MBEDTLS_RSA_C) */
#if defined(MBEDTLS_ECP_C)
    if( PSA_KEY_TYPE_IS_ECC( slot->attr.type ) )
    {
#if defined(MBEDTLS_ECDSA_C)
        if(
#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
            PSA_ALG_IS_ECDSA( alg )
#else
            PSA_ALG_IS_RANDOMIZED_ECDSA( alg )
#endif
            )
            status = psa_ecdsa_sign( slot->data.ecp,
                                     alg,
                                     hash, hash_length,
                                     signature, signature_size,
                                     signature_length );
        else
#endif /* defined(MBEDTLS_ECDSA_C) */
        {
            status = PSA_ERROR_INVALID_ARGUMENT;
        }
    }
    else
#endif /* defined(MBEDTLS_ECP_C) */
    {
        status = PSA_ERROR_NOT_SUPPORTED;
    }

exit:
    /* Fill the unused part of the output buffer (the whole buffer on error,
     * the trailing part on success) with something that isn't a valid mac
     * (barring an attack on the mac and deliberately-crafted input),
     * in case the caller doesn't check the return status properly. */
    if( status == PSA_SUCCESS )
        memset( signature + *signature_length, '!',
                signature_size - *signature_length );
    else
        memset( signature, '!', signature_size );
    /* If signature_size is 0 then we have nothing to do. We must not call
     * memset because signature may be NULL in this case. */
    return( status );
}